

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O3

void __thiscall
cmTargetPropCommandBase::HandleInterfaceContent
          (cmTargetPropCommandBase *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  cmValue __rhs;
  undefined8 *puVar3;
  undefined7 in_register_00000009;
  size_type *psVar4;
  ulong uVar5;
  string totalContent;
  string propName;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  _Storage<cmListFileBacktrace,_false> local_70;
  undefined1 local_60 [48];
  
  if ((int)CONCAT71(in_register_00000009,prepend) == 0) {
    std::operator+(&local_90,"INTERFACE_",&this->Property);
    (*this->_vptr_cmTargetPropCommandBase[6])(&local_b0,this,content);
    local_60[0] = '\0';
    cmTarget::AppendProperty
              (tgt,&local_90,&local_b0,(optional<cmListFileBacktrace> *)&local_70._M_value,false);
    if ((local_60[0] == '\x01') &&
       (local_60[0] = '\0',
       local_70._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_70._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return;
    }
    goto LAB_00296ec5;
  }
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"INTERFACE_","");
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(this->Property)._M_dataplus._M_p);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_90.field_2._M_allocated_capacity = *psVar4;
    local_90.field_2._8_8_ = plVar2[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar4;
    local_90._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_90._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  __rhs = cmTarget::GetProperty(tgt,&local_90);
  (*this->_vptr_cmTargetPropCommandBase[6])(&local_70,this,content);
  if (__rhs.Value == (string *)0x0) {
    local_60._16_8_ = local_60 + 0x20;
    local_60._24_8_ = 0;
    local_60[0x20] = '\0';
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_60 + 0x10),";",__rhs.Value);
  }
  uVar5 = 0xf;
  if (local_70._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)local_60) {
    uVar5 = CONCAT71(local_60._1_7_,local_60[0]);
  }
  if (uVar5 < (ulong)(local_60._24_8_ +
                     (long)local_70._M_value.
                           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)) {
    uVar5 = 0xf;
    if ((undefined1 *)local_60._16_8_ != local_60 + 0x20) {
      uVar5 = CONCAT71(local_60._33_7_,local_60[0x20]);
    }
    if (uVar5 < (ulong)(local_60._24_8_ +
                       (long)local_70._M_value.
                             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)) goto LAB_00296fb5;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace
                       ((long)local_60 + 0x10,0,(char *)0x0,
                        (ulong)local_70._M_value.
                               super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
  }
  else {
LAB_00296fb5:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,local_60._16_8_);
  }
  psVar4 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0.field_2._8_8_ = puVar3[3];
    local_b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_b0._M_string_length = puVar3[1];
  *puVar3 = psVar4;
  puVar3[1] = 0;
  *(undefined1 *)psVar4 = 0;
  if ((undefined1 *)local_60._16_8_ != local_60 + 0x20) {
    operator_delete((void *)local_60._16_8_,CONCAT71(local_60._33_7_,local_60[0x20]) + 1);
  }
  if (local_70._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)local_60) {
    operator_delete(local_70._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,CONCAT71(local_60._1_7_,local_60[0]) + 1);
  }
  cmTarget::SetProperty(tgt,&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == &local_90.field_2) {
    return;
  }
LAB_00296ec5:
  operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void cmTargetPropCommandBase::HandleInterfaceContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool prepend, bool)
{
  if (prepend) {
    const std::string propName = std::string("INTERFACE_") + this->Property;
    cmValue propValue = tgt->GetProperty(propName);
    const std::string totalContent =
      this->Join(content) + (propValue ? (";" + *propValue) : std::string());
    tgt->SetProperty(propName, totalContent);
  } else {
    tgt->AppendProperty("INTERFACE_" + this->Property, this->Join(content));
  }
}